

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyzer.cpp
# Opt level: O1

void __thiscall
SemanticAnalyzerRun::onEnterFunctionInvocationExpressionAstNode
          (SemanticAnalyzerRun *this,FunctionInvocationExpressionAstNode *node)

{
  undefined1 local_48 [16];
  undefined8 local_38;
  undefined1 local_30;
  
  Scope::find((optional<VariableDefinition> *)local_48,
              (this->currentScope).super___shared_ptr<Scope,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
              &((node->identifier).super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               value,true);
  if ((bool)local_30 == true) {
    local_30 = false;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
    }
  }
  else {
    local_48._0_8_ = (element_type *)&stack0xffffffffffffffc8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_48,"Undefined reference in function invocation.","");
    reportError(this,&node->identifier,(string *)local_48);
    if ((element_type *)local_48._0_8_ != (element_type *)&stack0xffffffffffffffc8) {
      operator_delete((void *)local_48._0_8_,local_38 + 1);
    }
  }
  return;
}

Assistant:

void onEnterFunctionInvocationExpressionAstNode(FunctionInvocationExpressionAstNode*  node) noexcept override {
    if (!this->currentScope->find(node->identifier->value, true)) {
      this->reportError(node->identifier, "Undefined reference in function invocation.");
    }
  }